

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O1

int __thiscall dic::rehash(dic *this,int dictidx)

{
  long lVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  void *pvVar5;
  pointer pdVar6;
  long lVar7;
  undefined8 *puVar8;
  long lVar9;
  void *key;
  int iVar10;
  int dictidx_00;
  dictht *ht;
  dic *this_00;
  undefined8 *puVar11;
  ulong uVar12;
  double dVar13;
  
  pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pdVar6[dictidx].type)->hashFunction = murmurhash2;
  uVar12 = pdVar6[dictidx].ht[0].size * 2;
  if (uVar12 < 3) {
    uVar4 = 2;
  }
  else {
    iVar10 = 2;
    do {
      dVar13 = exp2((double)iVar10);
      uVar4 = (long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13;
      iVar10 = iVar10 + 1;
    } while (uVar4 < uVar12);
  }
  pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(ulong *)((long)(pdVar6[dictidx].ht + 1) + 8) = uVar4;
  *(ulong *)((long)(pdVar6[dictidx].ht + 1) + 0x10) = uVar4 - 1;
  uVar12 = 0;
  pvVar5 = operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 << 3);
  pdVar6[dictidx].ht[1].table = (dictEntry **)pvVar5;
  pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar6[dictidx].ht[0].size != 0) {
    do {
      for (puVar11 = *(undefined8 **)((long)pdVar6[dictidx].ht[0].table + uVar12 * 8);
          puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)puVar11[2]) {
        uVar3 = (*((this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                   super__Vector_impl_data._M_start[dictidx].type)->hashFunction)(*puVar11);
        pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar9 = (long)pdVar6[dictidx].ht[1].table;
        lVar7 = (long)(int)(uVar3 & *(uint *)((long)(pdVar6[dictidx].ht + 1) + 0x10));
        lVar1 = *(long *)(lVar9 + lVar7 * 8);
        if (lVar1 == 0) {
          puVar8 = (undefined8 *)(lVar9 + lVar7 * 8);
        }
        else {
          do {
            lVar9 = lVar1;
            lVar1 = *(long *)(lVar9 + 0x10);
          } while (lVar1 != 0);
          puVar8 = (undefined8 *)(lVar9 + 0x10);
        }
        *puVar8 = puVar11;
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < pdVar6[dictidx].ht[0].size);
  }
  pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar6[dictidx].ht[0].size != 0) {
    uVar12 = 0;
    do {
      pvVar5 = *(void **)((long)pdVar6[dictidx].ht[0].table + uVar12 * 8);
      while (pvVar5 != (void *)0x0) {
        pvVar2 = *(void **)((long)pvVar5 + 0x10);
        operator_delete(pvVar5);
        pvVar5 = pvVar2;
      }
      uVar12 = (ulong)((int)uVar12 + 1);
      pdVar6 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < pdVar6[dictidx].ht[0].size);
  }
  ht = pdVar6[dictidx].ht + 1;
  this_00 = (dic *)pdVar6[dictidx].ht;
  dictht::operator=((dictht *)this_00,ht);
  dictidx_00 = (int)ht;
  iVar10 = *(int *)(*(long *)&(this_00->dc).super__Vector_base<dict,_std::allocator<dict>_> +
                   ((long)dictidx_00 * 0xb + 10) * 8);
  pvVar5 = dict_find(this_00,dictidx_00,0,key);
  if (iVar10 != -1) {
    if (pvVar5 != (void *)0x0) goto LAB_00106e02;
    pvVar5 = dict_find(this_00,dictidx_00,1,key);
  }
  if (pvVar5 == (void *)0x0) {
    return 0;
  }
LAB_00106e02:
  return (int)*(undefined8 *)((long)pvVar5 + 8);
}

Assistant:

int dic::rehash(int dictidx){
    int i=1,index;
    dictEntry *tmp=NULL;
    dc[dictidx].type->hashFunction=dic::murmurhash2;
    unsigned long newsize=dc[dictidx].ht[0].size*2;
    unsigned long tmpsize=pow(2,i);
    while(newsize>tmpsize){
        tmpsize=pow(2,++i);
    }
    newsize=tmpsize;

    dc[dictidx].ht[1].size=newsize;
    dc[dictidx].ht[1].sizemask=newsize-1;
    dc[dictidx].ht[1].table=new dictEntry*[newsize];

    dictEntry *fetch=NULL;
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            index=dc[dictidx].type->hashFunction(fetch->key)&dc[dictidx].ht[1].sizemask;
            tmp=dc[dictidx].ht[1].table[index];
            if(tmp==NULL)
                dc[dictidx].ht[1].table[index]=fetch;
            else
            {
                while(tmp->next!=NULL){
                    tmp=tmp->next;
                }
                tmp->next=fetch;
            }
            fetch=fetch->next;
        }
    }
    //ht[0] -> ht[1] done

    //relese ht[0]
    fetch=tmp=NULL;    
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  

    //override =
    dc[dictidx].ht[0]=dc[dictidx].ht[1];


    dictht *newht=NULL;
    newht->table=NULL;
    newht->size=0;
    newht->sizemask=0;
    newht->used=0;
    dc[dictidx].ht[1]=*newht;

    return 1;
}